

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.h
# Opt level: O2

int __thiscall vm_val_t::get_logical_only(vm_val_t *this)

{
  if (this->typ == VM_TRUE) {
    return 1;
  }
  if (this->typ == VM_NIL) {
    return 0;
  }
  err_throw(0x900);
}

Assistant:

int get_logical_only() const
    {
        if (typ == VM_TRUE)
            return TRUE;
        else if (typ == VM_NIL)
            return FALSE;
        else
        {
            err_throw(VMERR_BAD_TYPE_BIF);
            AFTER_ERR_THROW(return FALSE;)
        }
    }